

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzerSettings.cpp
# Opt level: O0

bool __thiscall I2sAnalyzerSettings::SetSettingsFromInterfaces(I2sAnalyzerSettings *this)

{
  byte bVar1;
  double dVar2;
  Channel local_88 [16];
  Channel local_78 [8];
  Channel data_channel;
  Channel local_68 [16];
  Channel local_58 [8];
  Channel frame_channel;
  Channel local_38 [16];
  Channel local_28 [8];
  Channel clock_channel;
  I2sAnalyzerSettings *this_local;
  
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mClockChannelInterface);
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::Channel(local_38,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  bVar1 = Channel::operator==(local_28,local_38);
  Channel::~Channel(local_38);
  if ((bVar1 & 1) != 0) {
    AnalyzerSettings::SetErrorText((char *)this);
    this_local._7_1_ = false;
    goto LAB_0010f7e1;
  }
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mFrameChannelInterface);
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::Channel(local_68,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  bVar1 = Channel::operator==(local_58,local_68);
  Channel::~Channel(local_68);
  if ((bVar1 & 1) == 0) {
    std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mDataChannelInterface);
    AnalyzerSettingInterfaceChannel::GetChannel();
    Channel::Channel(local_88,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    bVar1 = Channel::operator==(local_78,local_88);
    Channel::~Channel(local_88);
    if ((bVar1 & 1) == 0) {
      bVar1 = Channel::operator==(local_28,local_58);
      if ((bVar1 & 1) == 0) {
        bVar1 = Channel::operator==(local_28,local_78);
        if ((bVar1 & 1) == 0) {
          bVar1 = Channel::operator==(local_58,local_78);
          if ((bVar1 & 1) == 0) {
            Channel::operator=(&this->mClockChannel,local_28);
            Channel::operator=(&this->mFrameChannel,local_58);
            Channel::operator=(&this->mDataChannel,local_78);
            std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                      (&this->mShiftOrderInterface);
            dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
            this->mShiftOrder = (ShiftOrder)(long)dVar2;
            std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                      (&this->mDataValidEdgeInterface);
            dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
            this->mDataValidEdge = (EdgeDirection)(long)dVar2;
            std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                      (&this->mBitsPerWordInterface);
            dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
            this->mBitsPerWord = (U32)(long)dVar2;
            std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                      (&this->mWordAlignmentInterface);
            dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
            this->mWordAlignment = (PcmWordAlignment)(long)dVar2;
            std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                      (&this->mFrameTypeInterface);
            dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
            this->mFrameType = (PcmFrameType)(long)dVar2;
            std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                      (&this->mBitAlignmentInterface);
            dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
            this->mBitAlignment = (PcmBitAlignment)(long)dVar2;
            std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mSignedInterface);
            dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
            this->mSigned = (Sign)(long)dVar2;
            std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                      (&this->mWordSelectInvertedInterface);
            dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
            this->mWordSelectInverted = (PcmWordSelectInverted)(long)dVar2;
            AnalyzerSettings::ClearChannels();
            AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,true);
            AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mFrameChannel,true);
            AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mDataChannel,true);
            this_local._7_1_ = true;
            goto LAB_0010f7b5;
          }
        }
      }
      AnalyzerSettings::SetErrorText((char *)this);
      this_local._7_1_ = false;
    }
    else {
      AnalyzerSettings::SetErrorText((char *)this);
      this_local._7_1_ = false;
    }
LAB_0010f7b5:
    Channel::~Channel(local_78);
  }
  else {
    AnalyzerSettings::SetErrorText((char *)this);
    this_local._7_1_ = false;
  }
  Channel::~Channel(local_58);
LAB_0010f7e1:
  Channel::~Channel(local_28);
  return this_local._7_1_;
}

Assistant:

bool I2sAnalyzerSettings::SetSettingsFromInterfaces()
{
    Channel clock_channel = mClockChannelInterface->GetChannel();
    if( clock_channel == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select a channel for I2S/PCM CLOCK signal" );
        return false;
    }

    Channel frame_channel = mFrameChannelInterface->GetChannel();
    if( frame_channel == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select a channel for I2S/PCM FRAME signal" );
        return false;
    }

    Channel data_channel = mDataChannelInterface->GetChannel();
    if( data_channel == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select a channel for I2S/PCM DATA signal" );
        return false;
    }

    if( ( clock_channel == frame_channel ) || ( clock_channel == data_channel ) || ( frame_channel == data_channel ) )
    {
        SetErrorText( "Please select different channels for the I2S/PCM signals" );
        return false;
    }

    mClockChannel = clock_channel;
    mFrameChannel = frame_channel;
    mDataChannel = data_channel;

    mShiftOrder = AnalyzerEnums::ShiftOrder( U32( mShiftOrderInterface->GetNumber() ) );
    mDataValidEdge = AnalyzerEnums::EdgeDirection( U32( mDataValidEdgeInterface->GetNumber() ) );
    mBitsPerWord = U32( mBitsPerWordInterface->GetNumber() );

    mWordAlignment = PcmWordAlignment( U32( mWordAlignmentInterface->GetNumber() ) );
    mFrameType = PcmFrameType( U32( mFrameTypeInterface->GetNumber() ) );
    mBitAlignment = PcmBitAlignment( U32( mBitAlignmentInterface->GetNumber() ) );

    mSigned = AnalyzerEnums::Sign( U32( mSignedInterface->GetNumber() ) );

    mWordSelectInverted = PcmWordSelectInverted( U32( mWordSelectInvertedInterface->GetNumber() ) );

    // AddExportOption( 0, "Export as text/csv file", "text (*.txt);;csv (*.csv)" );

    ClearChannels();
    AddChannel( mClockChannel, "PCM CLOCK", true );
    AddChannel( mFrameChannel, "PCM FRAME", true );
    AddChannel( mDataChannel, "PCM DATA", true );

    return true;
}